

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O2

void __thiscall ID_table_t::erase(ID_table_t *this,string *id_name)

{
  pointer pIVar1;
  __type _Var2;
  Exception *this_00;
  const_iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __position._M_current =
       (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data.
       _M_start;
  pIVar1 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  while( true ) {
    if (__position._M_current == pIVar1) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      Exception::Exception(this_00,"Scanner error: identifier not found: ",id_name);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&(__position._M_current)->name);
    _Var2 = std::operator==(id_name,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) break;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<ID,_std::allocator<ID>_>::erase(&this->table,__position);
  return;
}

Assistant:

void ID_table_t::erase(const string& id_name){
    vector<ID>::iterator ptr = table.begin();
    vector<ID>::iterator end  = table.end();

    while(ptr != end){
        if(id_name == ptr->get_name()){
            table.erase(ptr);
            return;
        }
        ++ptr;
    }
    throw Exception("Scanner error: identifier not found: ", id_name);
}